

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
AppParametersTest_multiword_value_eq_Test::TestBody(AppParametersTest_multiword_value_eq_Test *this)

{
  allocator<char8_t> *paVar1;
  allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  *this_00;
  allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
  *this_01;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  __l_00;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char **ppcVar5;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *this_02;
  char *pcVar6;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  *this_03;
  vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  *this_04;
  unordered_set<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  *this_05;
  object *poVar7;
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  *local_668;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *local_648;
  AssertHelper local_598 [8];
  Message local_590 [15];
  allocator<char8_t> local_581;
  u8string local_580 [32];
  undefined1 local_560 [8];
  AssertionResult gtest_ar_6;
  Message local_548 [15];
  allocator<char8_t> local_539;
  u8string local_538 [32];
  undefined1 local_518 [8];
  AssertionResult gtest_ar_5;
  Message local_500 [15];
  allocator<char8_t> local_4f1;
  u8string local_4f0 [32];
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_4a0 [8];
  Message local_498 [15];
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__1;
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  local_468;
  undefined1 auStack_408 [32];
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  expected_values;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_3b0;
  u8string local_390 [32];
  undefined1 local_370 [24];
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  expected_args;
  object obj;
  Message local_300 [12];
  uint local_2f4;
  unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>
  local_2f0 [56];
  size_type local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_3;
  Message local_298 [12];
  uint local_28c;
  size_type local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_2;
  Message local_268 [12];
  uint local_25c;
  size_type local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_1;
  Message local_238 [12];
  uint local_22c;
  size_type local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1f0 [8];
  Message local_1e8 [15];
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_;
  app_parameters local_180 [8];
  app_parameters parameters;
  undefined1 local_30 [8];
  ArgWrapper<char> args;
  AppParametersTest_multiword_value_eq_Test *this_local;
  
  args.m_argv._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl =
       (__uniq_ptr_data<const_char_*,_std::default_delete<const_char_*[]>,_true,_true>)
       (__uniq_ptr_data<const_char_*,_std::default_delete<const_char_*[]>,_true,_true>)this;
  ArgWrapper<char>::ArgWrapper<char_const*,char_const*,char_const*>
            ((ArgWrapper<char> *)local_30,"/path/to/exe","-key=valuePart1","valuePart2");
  iVar4 = ArgWrapper<char>::argc((ArgWrapper<char> *)local_30);
  ppcVar5 = ArgWrapper<char>::argv((ArgWrapper<char> *)local_30);
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (local_180,iVar4,ppcVar5,(char **)0x0,(unordered_set *)&gtest_ar_.message_);
  std::
  unordered_set<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  ::~unordered_set((unordered_set<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
                    *)&gtest_ar_.message_);
  this_02 = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
            jessilib::app_parameters::name_abi_cxx11_();
  local_1d9 = std::__cxx11::
              basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::empty
                        (this_02);
  local_1d9 = !local_1d9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar2) {
    testing::Message::Message(local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_1d8,"parameters.name().empty()","true");
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xde,pcVar6);
    testing::internal::AssertHelper::operator=(local_1f0,local_1e8);
    testing::internal::AssertHelper::~AssertHelper(local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  this_03 = (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)jessilib::app_parameters::arguments_abi_cxx11_();
  local_228 = std::
              vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ::size(this_03);
  local_22c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_220,"parameters.arguments().size()","2U",&local_228,&local_22c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar2) {
    testing::Message::Message(local_238);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xdf,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  this_04 = (vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
             *)jessilib::app_parameters::switches();
  local_258 = std::
              vector<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
              ::size(this_04);
  local_25c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_250,"parameters.switches().size()","0U",&local_258,&local_25c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar2) {
    testing::Message::Message(local_268);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  this_05 = (unordered_set<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
             *)jessilib::app_parameters::switches_set();
  local_288 = std::
              unordered_set<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
              ::size(this_05);
  local_28c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_280,"parameters.switches_set().size()","0U",&local_288,&local_28c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar2) {
    testing::Message::Message(local_298);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  jessilib::app_parameters::values();
  local_2b8 = std::
              unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>
              ::size(local_2f0);
  local_2f4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_2b0,"parameters.values().size()","1U",&local_2b8,&local_2f4);
  std::
  unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>
  ::~unordered_map(local_2f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(local_300);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&obj.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe2,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&obj.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38),local_300);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&obj.m_value.
                       super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       .
                       super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                       .
                       super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
               + 0x38));
    testing::Message::~Message(local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  jessilib::app_parameters::as_object();
  expected_values._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
  paVar1 = (allocator<char8_t> *)
           ((long)&expected_values._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
  std::allocator<char8_t>::allocator(paVar1);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>
            ((u8string *)&local_3b0,"-key=valuePart1",paVar1);
  paVar1 = (allocator<char8_t> *)
           ((long)&expected_values._M_t._M_impl.super__Rb_tree_header._M_node_count + 6);
  std::allocator<char8_t>::allocator(paVar1);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_390,"valuePart2",paVar1);
  expected_values._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  local_370._0_8_ = &local_3b0;
  local_370._8_8_ = 2;
  this_00 = (allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
             *)((long)&expected_values._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
  std::
  allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::allocator(this_00);
  __l_00._M_len = local_370._8_8_;
  __l_00._M_array = (iterator)local_370._0_8_;
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
            *)(local_370 + 0x10),__l_00,this_00);
  std::
  allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                *)((long)&expected_values._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  local_648 = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
              local_370;
  do {
    local_648 = local_648 + -1;
    std::__cxx11::u8string::~u8string((u8string *)local_648);
  } while (local_648 != &local_3b0);
  std::allocator<char8_t>::~allocator
            ((allocator<char8_t> *)
             ((long)&expected_values._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
  std::allocator<char8_t>::~allocator
            ((allocator<char8_t> *)
             ((long)&expected_values._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  ::pair<const_char8_t_(&)[4],_const_char8_t_(&)[22],_true>
            (&local_468,(char8_t (*) [4])0x69bfc7,(char8_t (*) [22])"valuePart1 valuePart2");
  auStack_408._8_8_ = &local_468;
  auStack_408._16_8_ = 1;
  this_01 = (allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
             *)((long)&gtest_ar__1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 6);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
  ::allocator(this_01);
  __l._M_len = auStack_408._16_8_;
  __l._M_array = (iterator)auStack_408._8_8_;
  std::
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::map((map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
         *)(auStack_408 + 0x18),__l,
        (less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
         *)((long)&gtest_ar__1.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7),this_01);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
                *)((long)&gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  + 6));
  local_668 = (pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
               *)auStack_408;
  do {
    local_668 = local_668 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
    ::~pair(local_668);
  } while (local_668 != &local_468);
  bVar3 = jessilib::object::null();
  local_489 = (bool)(~bVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_488,&local_489,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar2) {
    testing::Message::Message(local_498);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_4.message_,local_488,"obj.null()","true");
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe7,pcVar6);
    testing::internal::AssertHelper::operator=(local_4a0,local_498);
    testing::internal::AssertHelper::~AssertHelper(local_4a0);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  std::allocator<char8_t>::allocator(&local_4f1);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_4f0,"Name",&local_4f1);
  poVar7 = (object *)
           jessilib::object::operator[]
                     ((u8string *)
                      &expected_args.
                       super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper::Compare<jessilib::object,_char8_t[13],_nullptr>
            ((EqHelper *)local_4d0,"obj[u8\"Name\"]","u8\"/path/to/exe\"",poVar7,
             (char8_t (*) [13])"/path/to/exe");
  std::__cxx11::u8string::~u8string(local_4f0);
  std::allocator<char8_t>::~allocator(&local_4f1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar2) {
    testing::Message::Message(local_500);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  std::allocator<char8_t>::allocator(&local_539);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_538,"Args",&local_539);
  poVar7 = (object *)
           jessilib::object::operator[]
                     ((u8string *)
                      &expected_args.
                       super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper::
  Compare<jessilib::object,_std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((EqHelper *)local_518,"obj[u8\"Args\"]","expected_args",poVar7,
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)(local_370 + 0x10));
  std::__cxx11::u8string::~u8string(local_538);
  std::allocator<char8_t>::~allocator(&local_539);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar2) {
    testing::Message::Message(local_548);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xe9,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  std::allocator<char8_t>::allocator(&local_581);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_580,"Values",&local_581);
  poVar7 = (object *)
           jessilib::object::operator[]
                     ((u8string *)
                      &expected_args.
                       super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper::
  Compare<jessilib::object,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>,_nullptr>
            ((EqHelper *)local_560,"obj[u8\"Values\"]","expected_values",poVar7,
             (map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
              *)(auStack_408 + 0x18));
  std::__cxx11::u8string::~u8string(local_580);
  std::allocator<char8_t>::~allocator(&local_581);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar2) {
    testing::Message::Message(local_590);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              (local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0xea,pcVar6);
    testing::internal::AssertHelper::operator=(local_598,local_590);
    testing::internal::AssertHelper::~AssertHelper(local_598);
    testing::Message::~Message(local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  std::
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  ::~map((map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
          *)(auStack_408 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)(local_370 + 0x10));
  jessilib::object::~object
            ((object *)
             &expected_args.
              super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  jessilib::app_parameters::~app_parameters(local_180);
  ArgWrapper<char>::~ArgWrapper((ArgWrapper<char> *)local_30);
  return;
}

Assistant:

TEST(AppParametersTest, multiword_value_eq) {
	ArgWrapper args{ "/path/to/exe", "-key=valuePart1", "valuePart2" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_FALSE(parameters.name().empty());
	EXPECT_EQ(parameters.arguments().size(), 2U);
	EXPECT_EQ(parameters.switches().size(), 0U);
	EXPECT_EQ(parameters.switches_set().size(), 0U);
	EXPECT_EQ(parameters.values().size(), 1U);

	auto obj = parameters.as_object();
	std::vector<std::u8string> expected_args{ u8"-key=valuePart1", u8"valuePart2" };
	std::map<std::u8string, object> expected_values{ { u8"key", u8"valuePart1 valuePart2" } };
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
	EXPECT_EQ(obj[u8"Args"], expected_args);
	EXPECT_EQ(obj[u8"Values"], expected_values);
}